

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  undefined1 *puVar1;
  urlpieces *puVar2;
  char **ppcVar3;
  byte bVar4;
  Curl_handler *pCVar5;
  undefined4 uVar6;
  _Bool _Var7;
  ushort uVar8;
  uint uVar9;
  CURLUcode CVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  int iVar13;
  connectdata *conn;
  char *pcVar14;
  CURLU *u;
  size_t sVar15;
  size_t sVar16;
  stsentry *psVar17;
  char *pcVar18;
  char *pcVar19;
  long lVar20;
  ulong uVar21;
  curl_trc_feat *pcVar22;
  undefined8 uVar23;
  CURLcode CVar24;
  ulong uVar25;
  ConnectBits CVar26;
  ulong uVar27;
  connectdata *conn_00;
  char *pcVar28;
  bool bVar29;
  curltime cVar30;
  _Bool waitpipe;
  _Bool force_reuse;
  char *newurl;
  connectdata *existing;
  _Bool local_7a;
  _Bool local_79;
  _Bool *local_78;
  _Bool *local_70;
  char *local_68 [4];
  undefined8 local_48;
  urlpieces *local_40;
  connectdata *local_38;
  
  *asyncp = false;
  Curl_req_hard_reset(&data->req,data);
  local_38 = (connectdata *)0x0;
  local_79 = false;
  local_7a = false;
  *asyncp = false;
  if ((data->state).url == (char *)0x0) {
    CVar12 = CURLE_URL_MALFORMAT;
    conn = (connectdata *)0x0;
    goto LAB_00160f86;
  }
  conn = (connectdata *)(*Curl_ccalloc)(1,0x588);
  if (conn == (connectdata *)0x0) {
LAB_001607c0:
    conn = (connectdata *)0x0;
  }
  else {
    conn->sock[0] = -1;
    conn->sock[1] = -1;
    conn->sockfd = -1;
    conn->writesockfd = -1;
    conn->connection_id = -1;
    (conn->primary).remote_port = -1;
    conn->remote_port = -1;
    Curl_conncontrol(conn,1);
    cVar30 = Curl_now();
    (conn->created).tv_sec = cVar30.tv_sec;
    (conn->created).tv_usec = cVar30.tv_usec;
    (conn->keepalive).tv_sec = (conn->created).tv_sec;
    (conn->keepalive).tv_usec = (conn->created).tv_usec;
    *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
    bVar4 = (data->set).proxytype;
    (conn->http_proxy).proxytype = bVar4;
    (conn->socks_proxy).proxytype = '\x04';
    pcVar14 = (data->set).str[0x26];
    uVar9 = 0;
    if (pcVar14 != (char *)0x0) {
      uVar9 = (uint)(*pcVar14 != '\0') << 4;
    }
    uVar21 = (ulong)uVar9;
    CVar26 = conn->bits;
    conn->bits = (ConnectBits)((ulong)CVar26 & 0xffffffffffffffef | uVar21);
    if (uVar21 == 0) {
      uVar27 = 0;
    }
    else {
      uVar27 = 1;
      if (2 < bVar4) {
        uVar27 = (ulong)(bVar4 == 3);
      }
    }
    uVar25 = (ulong)(uint)((int)uVar27 * 2) ^ 2;
    if (uVar21 == 0) {
      uVar25 = 0;
    }
    CVar26 = (ConnectBits)(uVar25 | uVar27 | (ulong)CVar26 & 0xffffffffffffffec | uVar21);
    conn->bits = CVar26;
    pcVar14 = (data->set).str[0x27];
    if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
      conn->bits = (ConnectBits)((ulong)CVar26 | 0x12);
    }
    CVar26 = (ConnectBits)
             (((ulong)conn->bits & 0xfffffffffffffffb) +
             (ulong)((data->state).aptr.proxyuser != (char *)0x0) * 4);
    conn->bits = CVar26;
    uVar21 = (ulong)(*(uint *)&(data->set).field_0x8ca >> 5 & 8);
    conn->bits = (ConnectBits)((ulong)CVar26 & 0xfffffffffffffff7 | uVar21);
    CVar26 = (ConnectBits)
             (((ulong)CVar26 & 0xffffffffffff7ff7 | uVar21) +
             (ulong)(*(uint *)&(data->set).field_0x8ca & 0x2000) * 4);
    conn->bits = CVar26;
    conn->bits = (ConnectBits)
                 (((ulong)CVar26 & 0xfffffffffffeffff) +
                 (ulong)(*(uint *)&(data->set).field_0x8ca & 0x4000) * 4);
    conn->ip_version = (data->set).ipver;
    conn->connect_only = (data->set).connect_only;
    conn->transport = '\x03';
    Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
    pcVar14 = (data->set).str[0x1e];
    if (pcVar14 != (char *)0x0) {
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      conn->localdev = pcVar14;
      if (pcVar14 == (char *)0x0) {
        (*Curl_cfree)((void *)0x0);
        (*Curl_cfree)(conn);
        goto LAB_001607c0;
      }
    }
    conn->localportrange = (data->set).localportrange;
    conn->localport = (data->set).localport;
    conn->fclosesocket = (data->set).fclosesocket;
    conn->closesocket_client = (data->set).closesocket_client;
    iVar13 = (conn->created).tv_usec;
    uVar6 = *(undefined4 *)&(conn->created).field_0xc;
    (conn->lastused).tv_sec = (conn->created).tv_sec;
    (conn->lastused).tv_usec = iVar13;
    *(undefined4 *)&(conn->lastused).field_0xc = uVar6;
    conn->gssapi_delegation = (data->set).gssapi_delegation;
  }
  if (conn == (connectdata *)0x0) {
    CVar12 = CURLE_OUT_OF_MEMORY;
    conn = (connectdata *)0x0;
    goto LAB_00160f86;
  }
  if ((data->set).uh == (CURLU *)0x0) {
    bVar29 = false;
  }
  else {
    bVar29 = ((data->state).field_0x744 & 2) == 0;
  }
  local_78 = asyncp;
  local_70 = protocol_done;
  up_free(data);
  if (bVar29) {
    u = curl_url_dup((data->set).uh);
  }
  else {
    u = curl_url();
  }
  (data->state).uh = u;
  CVar12 = CURLE_OUT_OF_MEMORY;
  if (u == (CURLU *)0x0) goto switchD_00160d9b_caseD_1;
  if (((data->set).str[0x1d] != (char *)0x0) &&
     (sVar15 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar15 == 0)) {
    pcVar14 = curl_maprintf("%s://%s",(data->set).str[0x1d],(data->state).url);
    if (pcVar14 == (char *)0x0) goto switchD_00160d9b_caseD_1;
    if (((data->state).field_0x745 & 0x40) != 0) {
      (*Curl_cfree)((data->state).url);
    }
    (data->state).url = pcVar14;
    puVar1 = &(data->state).field_0x745;
    *puVar1 = *puVar1 | 0x40;
  }
  CVar24 = CURLE_OUT_OF_MEMORY;
  if (bVar29) goto LAB_001609ab;
  uVar9 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x20);
  CVar10 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                        (uVar9 >> 10 & 0x20) + (uVar9 >> 5 & 0x10) + 0x208);
  if (CVar10 != CURLUE_OK) {
    pcVar14 = curl_url_strerror(CVar10);
    bVar29 = false;
    Curl_failf(data,"URL rejected: %s",pcVar14);
    if (CVar10 == CURLUE_USER_NOT_ALLOWED) {
switchD_00160951_caseD_8:
      CVar24 = CURLE_LOGIN_DENIED;
      goto LAB_0016099c;
    }
    if (CVar10 == CURLUE_OUT_OF_MEMORY) goto switchD_00160951_caseD_7;
    CVar24 = CURLE_URL_MALFORMAT;
    if (CVar10 == CURLUE_UNSUPPORTED_SCHEME) goto switchD_00160951_caseD_5;
    goto switchD_00160951_caseD_1;
  }
  bVar29 = false;
  CVar10 = curl_url_get(u,CURLUPART_URL,local_68,0);
  CVar24 = CURLE_URL_MALFORMAT;
  switch(CVar10) {
  case CURLUE_OK:
    if (((data->state).field_0x745 & 0x40) != 0) {
      (*Curl_cfree)((data->state).url);
    }
    (data->state).url = local_68[0];
    puVar1 = &(data->state).field_0x745;
    *puVar1 = *puVar1 | 0x40;
    CVar24 = CURLE_OUT_OF_MEMORY;
    bVar29 = true;
    break;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_00160951_caseD_5:
    CVar24 = CURLE_UNSUPPORTED_PROTOCOL;
    goto LAB_0016099c;
  case CURLUE_OUT_OF_MEMORY:
switchD_00160951_caseD_7:
    CVar24 = CURLE_OUT_OF_MEMORY;
LAB_0016099c:
    bVar29 = false;
    break;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_00160951_caseD_8;
  }
switchD_00160951_caseD_1:
  CVar12 = CVar24;
  if (!bVar29) goto switchD_00160d9b_caseD_1;
LAB_001609ab:
  puVar2 = &(data->state).up;
  CVar10 = curl_url_get(u,CURLUPART_SCHEME,&puVar2->scheme,0);
  switch(CVar10) {
  case CURLUE_OK:
    ppcVar3 = &(data->state).up.hostname;
    CVar10 = curl_url_get(u,CURLUPART_HOST,ppcVar3,0);
    if (CVar10 == CURLUE_OK) {
      sVar16 = strlen(*ppcVar3);
      if (sVar16 < 0x10000) goto LAB_00160a43;
      Curl_failf(data,"Too long hostname (maximum is %d)",0xffff);
      goto switchD_001609db_caseD_1;
    }
    iVar13 = curl_strequal("file",puVar2->scheme);
    if (iVar13 == 0) goto switchD_001609db_caseD_7;
LAB_00160a43:
    pcVar14 = *ppcVar3;
    local_40 = puVar2;
    if (pcVar14 == (char *)0x0) {
      pcVar18 = (char *)0x0;
    }
    else {
      pcVar18 = pcVar14;
      if (*pcVar14 == '[') {
        puVar1 = &(conn->bits).field_0x1;
        *puVar1 = *puVar1 | 4;
        pcVar18 = pcVar14 + 1;
        sVar16 = strlen(pcVar18);
        pcVar14[sVar16] = '\0';
        zonefrom_url(u,data,conn);
      }
    }
    pcVar14 = "";
    if (pcVar18 != (char *)0x0) {
      pcVar14 = pcVar18;
    }
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    (conn->host).rawalloc = pcVar14;
    if (pcVar14 == (char *)0x0) goto switchD_001609db_caseD_7;
    (conn->host).name = pcVar14;
    CVar12 = Curl_idnconvert_hostname(&conn->host);
    puVar2 = local_40;
    if (CVar12 != CURLE_OK) break;
    if (((data->hsts != (hsts *)0x0) &&
        (iVar13 = curl_strequal("http",local_40->scheme), iVar13 != 0)) &&
       (psVar17 = Curl_hsts(data->hsts,(conn->host).name,true), psVar17 != (stsentry *)0x0)) {
      (*Curl_cfree)(puVar2->scheme);
      puVar2->scheme = (char *)0x0;
      CVar10 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
      switch(CVar10) {
      case CURLUE_OK:
        if (((data->state).field_0x745 & 0x40) != 0) {
          (*Curl_cfree)((data->state).url);
          (data->state).url = (char *)0x0;
        }
        CVar10 = curl_url_get(u,CURLUPART_URL,local_68,0);
        switch(CVar10) {
        case CURLUE_OK:
          CVar10 = curl_url_get(u,CURLUPART_SCHEME,&local_40->scheme,0);
          if (CVar10 == CURLUE_OK) {
            (data->state).url = local_68[0];
            puVar1 = &(data->state).field_0x745;
            *puVar1 = *puVar1 | 0x40;
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar22 = (data->state).feat, pcVar22 == (curl_trc_feat *)0x0 ||
                (0 < pcVar22->log_level)))) {
              Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
            }
            bVar29 = true;
            CVar12 = CVar24;
          }
          else {
            (*Curl_cfree)(local_68[0]);
            if (CVar10 == CURLUE_USER_NOT_ALLOWED) goto switchD_00160b4d_caseD_8;
            if (CVar10 == CURLUE_OUT_OF_MEMORY) goto switchD_00160b4d_caseD_7;
            if (CVar10 == CURLUE_UNSUPPORTED_SCHEME) goto switchD_00160b4d_caseD_5;
            bVar29 = false;
            CVar12 = CURLE_URL_MALFORMAT;
          }
          break;
        default:
          goto switchD_00160b4d_caseD_1;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_00160b4d_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_00160b4d_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_00160b4d_caseD_8;
        }
        goto LAB_00160bfa;
      default:
switchD_00160b4d_caseD_1:
        CVar12 = CURLE_URL_MALFORMAT;
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_00160b4d_caseD_5:
        CVar12 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
switchD_00160b4d_caseD_7:
        CVar12 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
switchD_00160b4d_caseD_8:
        CVar12 = CURLE_LOGIN_DENIED;
      }
      bVar29 = false;
LAB_00160bfa:
      CVar24 = CVar12;
      if (!bVar29) break;
    }
    CVar12 = findprotocol(data,conn,(data->state).up.scheme);
    if (CVar12 != CURLE_OK) break;
    CVar11 = CURLE_OK;
    if ((data->set).str[0x2e] == (char *)0x0) {
      ppcVar3 = &(data->state).up.password;
      CVar12 = CURLE_URL_MALFORMAT;
      CVar10 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar3,0);
      CVar11 = CURLE_OK;
      switch(CVar10) {
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_001609db_caseD_5;
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
        break;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_001609db_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_001609db_caseD_8;
      case CURLUE_NO_PASSWORD:
        goto switchD_00160cac_caseD_c;
      default:
        if (CVar10 == CURLUE_OK) {
          local_48 = 0;
          uVar23 = 0;
          CVar11 = Curl_urldecode(*ppcVar3,0,local_68,(size_t *)0x0,
                                  ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
          CVar12 = CVar11;
          if (CVar11 == CURLE_OK) {
            conn->passwd = local_68[0];
            CVar11 = Curl_setstropt(&(data->state).aptr.passwd,local_68[0]);
            local_48 = CONCAT71((int7)((ulong)uVar23 >> 8),CVar11 == CURLE_OK);
            CVar12 = CVar24;
            if (CVar11 != CURLE_OK) {
              CVar12 = CVar11;
            }
          }
          if ((char)local_48 != '\0') goto switchD_00160cac_caseD_c;
        }
      }
      break;
    }
switchD_00160cac_caseD_c:
    if ((data->set).str[0x2d] == (char *)0x0) {
      local_48 = CONCAT44(local_48._4_4_,CVar11);
      ppcVar3 = &(data->state).up.user;
      CVar10 = curl_url_get(u,CURLUPART_USER,ppcVar3,0);
      switch(CVar10) {
      case CURLUE_OK:
        CVar12 = Curl_urldecode(*ppcVar3,0,local_68,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar12 != CURLE_OK) goto switchD_00160d9b_caseD_1;
        conn->user = local_68[0];
        CVar12 = Curl_setstropt(&(data->state).aptr.user,local_68[0]);
        break;
      default:
        goto switchD_001609db_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_001609db_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_001609db_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_001609db_caseD_8;
      case CURLUE_NO_USER:
        CVar12 = (CURLcode)local_48;
        if ((data->state).aptr.passwd != (char *)0x0) {
          CVar12 = Curl_setstropt(&(data->state).aptr.user,"");
        }
      }
      if (CVar12 != CURLE_OK) break;
    }
    ppcVar3 = &(data->state).up.options;
    CVar10 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar3,0x40);
    switch(CVar10) {
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_001609db_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
switchD_001609db_caseD_7:
      CVar12 = CURLE_OUT_OF_MEMORY;
      break;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_001609db_caseD_8;
    case CURLUE_NO_OPTIONS:
switchD_00160c6f_caseD_d:
      CVar10 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
      CVar12 = CURLE_URL_MALFORMAT;
      switch(CVar10) {
      case CURLUE_OK:
        CVar10 = curl_url_get(u,CURLUPART_PORT,&(data->state).up.port,1);
        if (CVar10 == CURLUE_OK) {
          uVar21 = strtoul((data->state).up.port,(char **)0x0,10);
          uVar8 = (data->set).use_port;
          if ((uVar8 == 0) || (((data->state).field_0x744 & 0x10) == 0)) {
            uVar8 = curlx_ultous(uVar21);
          }
          conn->remote_port = (uint)uVar8;
          (conn->primary).remote_port = (uint)uVar8;
        }
        else {
          iVar13 = curl_strequal("file",local_40->scheme);
          CVar12 = CURLE_OUT_OF_MEMORY;
          if (iVar13 == 0) break;
        }
        CVar12 = CURLE_OK;
        curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
        uVar9 = (data->set).scope_id;
        if (uVar9 != 0) {
          conn->scope_id = uVar9;
        }
        break;
      case CURLUE_BAD_HANDLE:
      case CURLUE_BAD_PARTPOINTER:
      case CURLUE_MALFORMED_INPUT:
      case CURLUE_BAD_PORT_NUMBER:
      case CURLUE_URLDECODE:
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_001609db_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_001609db_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_001609db_caseD_8;
      default:
        goto switchD_001609db_caseD_1;
      }
      break;
    default:
      if (CVar10 == CURLUE_OK) {
        pcVar14 = (*Curl_cstrdup)(*ppcVar3);
        conn->options = pcVar14;
        if (pcVar14 != (char *)0x0) goto switchD_00160c6f_caseD_d;
        goto switchD_001609db_caseD_7;
      }
    case CURLUE_URLDECODE:
    case CURLUE_UNKNOWN_PART:
    case CURLUE_NO_SCHEME:
    case CURLUE_NO_USER:
    case CURLUE_NO_PASSWORD:
switchD_001609db_caseD_1:
      CVar12 = CURLE_URL_MALFORMAT;
    }
    break;
  default:
    goto switchD_001609db_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_001609db_caseD_5:
    CVar12 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_001609db_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_001609db_caseD_8:
    CVar12 = CURLE_LOGIN_DENIED;
  }
switchD_00160d9b_caseD_1:
  protocol_done = local_70;
  asyncp = local_78;
  if (CVar12 != CURLE_OK) goto LAB_00160f86;
  pcVar14 = (data->set).str[0x42];
  if (pcVar14 != (char *)0x0) {
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    conn->sasl_authzid = pcVar14;
    if (pcVar14 != (char *)0x0) goto LAB_00160e3c;
LAB_00160f80:
    CVar12 = CURLE_OUT_OF_MEMORY;
    goto LAB_00160f86;
  }
LAB_00160e3c:
  pcVar14 = (data->set).str[0x3c];
  if (pcVar14 != (char *)0x0) {
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    conn->oauth_bearer = pcVar14;
    if (pcVar14 == (char *)0x0) goto LAB_00160f80;
  }
  pcVar14 = (data->set).str[0x3d];
  if (pcVar14 != (char *)0x0) {
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    conn->unix_domain_socket = pcVar14;
    if (pcVar14 == (char *)0x0) goto LAB_00160f80;
    conn->bits = (ConnectBits)
                 ((ulong)conn->bits & 0xfffffffffbffffff |
                 (ulong)((uint)(*(ulong *)&(data->set).field_0x8ca >> 0x14) & 0x4000000));
  }
  if (((ulong)conn->bits & 4) == 0) {
LAB_00160f3c:
    pcVar14 = (data->set).str[0x26];
    if (pcVar14 == (char *)0x0) {
      pcVar14 = (char *)0x0;
    }
    else {
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      if (pcVar14 == (char *)0x0) {
        Curl_failf(data,"memory shortage");
        CVar12 = CURLE_OUT_OF_MEMORY;
        goto LAB_0016103a;
      }
    }
    pcVar18 = (data->set).str[0x27];
    if (pcVar18 == (char *)0x0) {
      pcVar18 = (char *)0x0;
    }
    else {
      pcVar18 = (*Curl_cstrdup)(pcVar18);
      if (pcVar18 == (char *)0x0) {
        pcVar18 = (char *)0x0;
        Curl_failf(data,"memory shortage");
        CVar12 = CURLE_OUT_OF_MEMORY;
        goto LAB_00161435;
      }
    }
    if ((data->set).str[0x32] == (char *)0x0) {
      pcVar28 = "no_proxy";
      pcVar19 = curl_getenv("no_proxy");
      if (pcVar19 == (char *)0x0) {
        pcVar28 = "NO_PROXY";
        pcVar19 = curl_getenv("NO_PROXY");
      }
      if (((data != (Curl_easy *)0x0 && pcVar19 != (char *)0x0) &&
          (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar22 = (data->state).feat, pcVar22 == (curl_trc_feat *)0x0 || (0 < pcVar22->log_level)
          ))) {
        Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar28,pcVar19);
      }
    }
    else {
      pcVar19 = (char *)0x0;
    }
    pcVar28 = (data->set).str[0x32];
    if (pcVar28 == (char *)0x0) {
      pcVar28 = pcVar19;
    }
    _Var7 = Curl_check_noproxy((conn->host).name,pcVar28);
    if (_Var7) {
      (*Curl_cfree)(pcVar14);
      (*Curl_cfree)(pcVar18);
      pcVar14 = (char *)0x0;
LAB_001610ef:
      pcVar18 = (char *)0x0;
    }
    else if (pcVar14 == (char *)0x0 && pcVar18 == (char *)0x0) {
      pcVar18 = (char *)local_68;
      curl_msnprintf(pcVar18,0x14,"%s_proxy",conn->handler->scheme);
      pcVar14 = curl_getenv(pcVar18);
      if (pcVar14 == (char *)0x0) {
        iVar13 = curl_strequal("http_proxy",(char *)local_68);
        if (iVar13 == 0) {
          Curl_strntoupper((char *)local_68,(char *)local_68,0x14);
          pcVar14 = curl_getenv((char *)local_68);
        }
        else {
          pcVar14 = (char *)0x0;
        }
      }
      if (pcVar14 == (char *)0x0) {
        pcVar18 = "all_proxy";
        pcVar14 = curl_getenv("all_proxy");
        if (pcVar14 == (char *)0x0) {
          pcVar18 = "ALL_PROXY";
          pcVar14 = curl_getenv("ALL_PROXY");
        }
      }
      if ((((data != (Curl_easy *)0x0) && (pcVar14 != (char *)0x0)) &&
          (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar22 = (data->state).feat, pcVar22 == (curl_trc_feat *)0x0 || (0 < pcVar22->log_level)
          ))) {
        Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar18,pcVar14);
      }
      goto LAB_001610ef;
    }
    (*Curl_cfree)(pcVar19);
    if (pcVar14 == (char *)0x0) {
LAB_00161122:
      pcVar14 = (char *)0x0;
    }
    else if (conn->unix_domain_socket != (char *)0x0) {
      (*Curl_cfree)(pcVar14);
      goto LAB_00161122;
    }
    if (pcVar14 == (char *)0x0) {
LAB_00161148:
      pcVar14 = (char *)0x0;
    }
    else if ((*pcVar14 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
      (*Curl_cfree)(pcVar14);
      goto LAB_00161148;
    }
    if (pcVar18 == (char *)0x0) {
LAB_0016116d:
      pcVar18 = (char *)0x0;
    }
    else if ((*pcVar18 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
      (*Curl_cfree)(pcVar18);
      goto LAB_0016116d;
    }
    if (pcVar14 == (char *)0x0 && pcVar18 == (char *)0x0) {
      *(byte *)&conn->bits = *(byte *)&conn->bits & 0xfc;
      pcVar18 = (char *)0x0;
      CVar12 = CURLE_OK;
LAB_001613e9:
      CVar26 = conn->bits;
      uVar21 = 0x10;
      if (((ulong)CVar26 & 1) == 0) {
        uVar21 = (ulong)(CVar26._0_4_ * 8 & 0x10);
      }
      conn->bits = (ConnectBits)((ulong)CVar26 & 0xffffffffffffffef | uVar21);
      if (uVar21 == 0) {
        conn->bits = (ConnectBits)((ulong)CVar26 & 0xffffffffffffffe0);
        (conn->http_proxy).proxytype = '\0';
      }
    }
    else {
      bVar4 = (conn->http_proxy).proxytype;
      if (pcVar14 == (char *)0x0) {
LAB_001611b4:
        if (pcVar18 != (char *)0x0) {
          CVar12 = parse_proxy(data,conn,pcVar18,(uint)bVar4);
          (*Curl_cfree)(pcVar18);
          if (CVar12 != CURLE_OK) {
            pcVar18 = (char *)0x0;
            goto LAB_001611db;
          }
        }
        pcVar14 = (conn->http_proxy).host.rawalloc;
        if (pcVar14 == (char *)0x0) {
          CVar26 = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff6);
        }
        else {
          if ((conn->handler->protocol & 3) == 0) {
            if (((conn->handler->flags & 0x800) == 0) || (((ulong)conn->bits & 8) != 0)) {
              *(byte *)&conn->bits = *(byte *)&conn->bits | 8;
            }
            else {
              conn->handler = &Curl_handler_http;
            }
          }
          CVar26 = (ConnectBits)((ulong)conn->bits | 1);
        }
        conn->bits = CVar26;
        if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
          CVar26 = (ConnectBits)((ulong)CVar26 & 0xfffffffffffffffd);
        }
        else {
          if ((pcVar14 == (char *)0x0) && ((conn->socks_proxy).user == (char *)0x0)) {
            pcVar14 = (conn->socks_proxy).passwd;
            (conn->socks_proxy).user = (conn->http_proxy).user;
            (conn->http_proxy).user = (char *)0x0;
            (*Curl_cfree)(pcVar14);
            (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
            (conn->http_proxy).passwd = (char *)0x0;
          }
          CVar26 = (ConnectBits)((ulong)conn->bits | 2);
        }
        conn->bits = CVar26;
        bVar29 = true;
        pcVar18 = (char *)0x0;
        CVar12 = CURLE_OK;
      }
      else {
        CVar12 = parse_proxy(data,conn,pcVar14,(uint)bVar4);
        (*Curl_cfree)(pcVar14);
        if (CVar12 == CURLE_OK) goto LAB_001611b4;
LAB_001611db:
        bVar29 = false;
      }
      if (bVar29) goto LAB_001613e9;
    }
    pcVar14 = (char *)0x0;
  }
  else {
    pcVar14 = (data->state).aptr.proxyuser;
    pcVar18 = (data->state).aptr.proxypasswd;
    if (pcVar14 == (char *)0x0) {
      pcVar14 = "";
    }
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    (conn->http_proxy).user = pcVar14;
    CVar12 = CURLE_OK;
    if (pcVar14 == (char *)0x0) {
LAB_00160f2c:
      bVar29 = false;
      CVar12 = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcVar14 = "";
      if (pcVar18 != (char *)0x0) {
        pcVar14 = pcVar18;
      }
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      (conn->http_proxy).passwd = pcVar14;
      bVar29 = true;
      if (pcVar14 == (char *)0x0) {
        (*Curl_cfree)((conn->http_proxy).user);
        (conn->http_proxy).user = (char *)0x0;
        goto LAB_00160f2c;
      }
    }
    if (bVar29) goto LAB_00160f3c;
LAB_0016103a:
    pcVar14 = (char *)0x0;
    pcVar18 = (char *)0x0;
  }
LAB_00161435:
  (*Curl_cfree)(pcVar18);
  (*Curl_cfree)(pcVar14);
  protocol_done = local_70;
  asyncp = local_78;
  if (CVar12 != CURLE_OK) goto LAB_00160f86;
  if (((conn->given->flags & 1) != 0) && (((ulong)conn->bits & 1) != 0)) {
    conn->bits = (ConnectBits)((ulong)conn->bits | 8);
  }
  uVar8 = (data->set).use_port;
  if ((uVar8 == 0) || (((data->state).field_0x744 & 0x10) == 0)) {
LAB_001614dd:
    CVar12 = CURLE_OK;
    bVar29 = true;
  }
  else {
    conn->remote_port = (uint)uVar8;
    bVar29 = false;
    curl_msnprintf((char *)local_68,0x10,"%d");
    CVar10 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_68,0);
    CVar12 = CURLE_OUT_OF_MEMORY;
    if (CVar10 == CURLUE_OK) goto LAB_001614dd;
  }
  if (((((((!bVar29) || (CVar12 = override_login(data,conn), CVar12 != CURLE_OK)) ||
         (CVar12 = set_login(data,conn), CVar12 != CURLE_OK)) ||
        (CVar12 = parse_connect_to_slist(data,conn,(data->set).connect_to), CVar12 != CURLE_OK)) ||
       ((((ulong)conn->bits & 1) != 0 &&
        (CVar12 = Curl_idnconvert_hostname(&(conn->http_proxy).host), CVar12 != CURLE_OK)))) ||
      ((((ulong)conn->bits & 2) != 0 &&
       (CVar12 = Curl_idnconvert_hostname(&(conn->socks_proxy).host), CVar12 != CURLE_OK)))) ||
     ((((conn->bits).field_0x1 & 1) != 0 &&
      (CVar12 = Curl_idnconvert_hostname(&conn->conn_to_host), CVar12 != CURLE_OK))))
  goto LAB_00160f86;
  if ((((conn->bits).field_0x1 & 1) != 0) &&
     (iVar13 = curl_strequal((conn->conn_to_host).name,(conn->host).name), iVar13 != 0)) {
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 & 0xfe;
  }
  if (((SUB84(conn->bits,0) >> 9 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
    conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffdff);
  }
  CVar26 = conn->bits;
  if (((ulong)CVar26 & 1) != 0 && ((ulong)CVar26 & 0x300) != 0) {
    conn->bits = (ConnectBits)((ulong)CVar26 | 8);
  }
  CVar12 = setup_connection_internals(data,conn);
  if (CVar12 != CURLE_OK) goto LAB_00160f86;
  pCVar5 = conn->handler;
  if ((pCVar5->flags & 0x10) != 0) {
    (data->info).conn_scheme = pCVar5->scheme;
    (data->info).conn_protocol = pCVar5->protocol & 0x3ffffff;
    CVar12 = (*pCVar5->connect_it)(data,(_Bool *)local_68);
    if (CVar12 == CURLE_OK) {
      Curl_attach_connection(data,conn);
      CVar12 = Curl_cpool_add_conn(data,conn);
      asyncp = local_78;
      protocol_done = local_70;
      if (CVar12 != CURLE_OK) goto LAB_00160f86;
      CVar12 = setup_range(data);
      if (CVar12 != CURLE_OK) {
        (*conn->handler->done)(data,CVar12,false);
        asyncp = local_78;
        protocol_done = local_70;
        goto LAB_00160f86;
      }
      Curl_xfer_setup_nop(data);
      CVar12 = CURLE_OK;
    }
    Curl_init_do(data,conn);
    asyncp = local_78;
    protocol_done = local_70;
    goto LAB_00160f86;
  }
  conn->recv[0] = Curl_cf_recv;
  conn->send[0] = Curl_cf_send;
  conn->recv[1] = Curl_cf_recv;
  conn->send[1] = Curl_cf_send;
  conn->bits = (ConnectBits)
               ((ulong)conn->bits & 0xffffffffff7fffff |
               (ulong)((uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x10) & 0x800000));
  CVar12 = Curl_ssl_easy_config_complete(data);
  asyncp = local_78;
  protocol_done = local_70;
  if (CVar12 != CURLE_OK) goto LAB_00160f86;
  Curl_cpool_prune_dead(data);
  if ((((((data->set).field_0x8cd & 0x40) == 0) || ((data->state).followlocation != 0)) &&
      ((data->set).connect_only == '\0')) &&
     (_Var7 = ConnectionExists(data,conn,&local_38,&local_79,&local_7a), conn_00 = local_38, _Var7))
  {
    reuse_conn(data,conn,local_38);
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar22 = (data->state).feat, pcVar22 == (curl_trc_feat *)0x0 || (0 < pcVar22->log_level)))
       ) {
      pcVar14 = "proxy";
      if (((ulong)conn_00->bits & 0x10) == 0) {
        pcVar14 = "host";
      }
      lVar20 = 0xc0;
      if (((conn_00->socks_proxy).host.name == (char *)0x0) &&
         (lVar20 = 0xf8, (conn_00->http_proxy).host.name == (char *)0x0)) {
        lVar20 = 0x70;
      }
      Curl_infof(data,"Re-using existing connection with %s %s",pcVar14,
                 *(undefined8 *)((long)&(conn_00->cpool_node)._list + lVar20));
    }
LAB_001618a8:
    Curl_init_do(data,conn_00);
    CVar12 = setup_range(data);
    conn = conn_00;
    asyncp = local_78;
    protocol_done = local_70;
    if (CVar12 == CURLE_OK) {
      if (((ulong)conn_00->bits & 0x40) == 0) {
        CVar12 = resolve_server(data,conn_00,local_78);
        asyncp = local_78;
        protocol_done = local_70;
        if (CVar12 != CURLE_OK) goto LAB_00160f86;
      }
      else {
        *local_78 = false;
      }
      pCVar5 = conn_00->handler;
      (data->info).conn_scheme = pCVar5->scheme;
      (data->info).conn_protocol = pCVar5->protocol & 0x3ffffff;
      (data->info).field_0xe4 = (data->info).field_0xe4 & 0xfd | *(byte *)&conn_00->bits >> 3 & 2;
      CVar12 = Curl_conn_ev_data_setup(data);
      asyncp = local_78;
      protocol_done = local_70;
    }
    goto LAB_00160f86;
  }
  if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8cf & 1) != 0)) {
    puVar1 = &(conn->bits).field_0x3;
    *puVar1 = *puVar1 | 1;
  }
  if (local_7a == false) {
    iVar13 = Curl_cpool_check_limits(data,conn);
    if (iVar13 == 2) {
      if (-1 < (data->set).dohfor_mid) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar22 = (data->state).feat, pcVar22 == (curl_trc_feat *)0x0 ||
            (0 < pcVar22->log_level)))) {
          Curl_infof(data,"Allowing DoH to override max connection limit");
        }
        goto LAB_00161aa3;
      }
      if (data == (Curl_easy *)0x0) goto LAB_00161bd9;
      if (((data->set).field_0x8cd & 0x10) != 0) {
        pcVar22 = (data->state).feat;
        pcVar14 = "No connections available in cache";
        goto LAB_00161bbb;
      }
      goto LAB_001619dc;
    }
    if (iVar13 != 1) {
LAB_00161aa3:
      CVar12 = Curl_ssl_conn_config_init(data,conn);
      asyncp = local_78;
      protocol_done = local_70;
      if (CVar12 != CURLE_OK) goto LAB_00160f86;
      Curl_attach_connection(data,conn);
      CVar12 = Curl_cpool_add_conn(data,conn);
      asyncp = local_78;
      protocol_done = local_70;
      if (CVar12 != CURLE_OK) goto LAB_00160f86;
      if ((((data->state).authhost.picked & 8) != 0) &&
         (((data->state).authhost.field_0x18 & 1) != 0)) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar22 = (data->state).feat, pcVar22 == (curl_trc_feat *)0x0 ||
            (0 < pcVar22->log_level)))) {
          Curl_infof(data,"NTLM picked AND auth done set, clear picked");
        }
        (data->state).authhost.picked = 0;
        puVar1 = &(data->state).authhost.field_0x18;
        *puVar1 = *puVar1 & 0xfe;
      }
      conn_00 = conn;
      if ((((data->state).authproxy.picked & 8) != 0) &&
         (((data->state).authproxy.field_0x18 & 1) != 0)) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar22 = (data->state).feat, pcVar22 == (curl_trc_feat *)0x0 ||
            (0 < pcVar22->log_level)))) {
          Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
        }
        (data->state).authproxy.picked = 0;
        puVar1 = &(data->state).authproxy.field_0x18;
        *puVar1 = *puVar1 & 0xfe;
      }
      goto LAB_001618a8;
    }
    if (data != (Curl_easy *)0x0) {
      if (((data->set).field_0x8cd & 0x10) != 0) {
        pcVar22 = (data->state).feat;
        pcVar14 = "No more connections allowed to host";
LAB_00161bbb:
        if ((pcVar22 == (curl_trc_feat *)0x0) || (0 < pcVar22->log_level)) {
          Curl_infof(data,pcVar14);
        }
      }
      goto LAB_001619dc;
    }
  }
  else {
LAB_001619dc:
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar22 = (data->state).feat, pcVar22 == (curl_trc_feat *)0x0 || (0 < pcVar22->log_level)))
       ) {
      Curl_infof(data,"No connections available.");
    }
  }
LAB_00161bd9:
  Curl_conn_free(data,conn);
  CVar12 = CURLE_NO_CONNECTION_AVAILABLE;
  conn = (connectdata *)0x0;
  asyncp = local_78;
  protocol_done = local_70;
LAB_00160f86:
  if (CVar12 == CURLE_OK) {
    sVar15 = Curl_llist_count(&conn->easyq);
    if (sVar15 < 2) {
      CVar12 = CURLE_OK;
      if (*asyncp == false) {
        CVar12 = Curl_setup_conn(data,protocol_done);
      }
    }
    else {
      *protocol_done = true;
      CVar12 = CURLE_OK;
    }
  }
  if (((CVar12 != CURLE_NO_CONNECTION_AVAILABLE) && (conn != (connectdata *)0x0)) &&
     (CVar12 != CURLE_OK)) {
    Curl_detach_connection(data);
    Curl_cpool_disconnect(data,conn,true);
  }
  return CVar12;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* Set the request to virgin state based on transfer settings */
  Curl_req_hard_reset(&data->req, data);

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that is either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We are not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_cpool_disconnect(data, conn, TRUE);
  }

  return result;
}